

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O3

void mjs::anon_unknown_33::define_own_property_checked
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *p,value *desc)

{
  property_attribute pVar1;
  property_attribute attributes;
  gc_heap *global_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  value *v;
  long *plVar6;
  uint *puVar7;
  undefined8 *puVar8;
  object *poVar9;
  void *pvVar10;
  undefined4 *puVar11;
  wostream *pwVar12;
  native_error_exception *pnVar13;
  global_object *pgVar14;
  wchar_t *pwVar15;
  wchar_t *pwVar16;
  undefined1 *puVar17;
  wstring_view p_00;
  wstring_view p_01;
  wstring_view p_02;
  wstring_view p_03;
  wstring_view p_04;
  wstring_view p_05;
  wstring_view p_06;
  wstring_view p_07;
  wstring_view p_08;
  wstring_view name;
  property_attribute current_attributes;
  value set;
  anon_class_16_2_d5e5c5aa check_accessor;
  property_attribute a;
  object_ptr temp;
  anon_class_24_3_a4a98722 apply_flag;
  wostringstream woss;
  property_attribute local_2ac;
  undefined1 local_2a8 [24];
  undefined1 local_290 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_288;
  undefined1 local_268 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_260;
  wchar_t local_23c;
  gc_heap *local_238;
  undefined1 local_230 [32];
  anon_class_24_3_a4a98722 local_210;
  gc_heap_ptr<mjs::global_object> *local_1f8;
  anon_union_32_5_7b1e0779_for_value_3 local_1f0;
  wchar_t *local_1d0;
  anon_union_32_5_7b1e0779_for_value_3 local_1c8;
  undefined1 local_1a8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_1a0 [11];
  
  local_2a8._16_8_ = p;
  local_238 = (gc_heap *)global;
  v = (value *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::validate_object((global_object *)local_2a8,v);
  plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
  local_1a0[0]._0_8_ = puVar7 + 1;
  local_1a8 = (undefined1  [8])(ulong)*puVar7;
  local_2ac = (**(code **)(*plVar6 + 0x30))(plVar6);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
  local_290 = (undefined1  [8])0x8;
  local_288.n_ = 8.45407584174457e-318;
  (**(code **)*puVar8)(local_1a8,puVar8);
  bVar2 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
  local_290 = (undefined1  [8])0xa;
  local_288.n_ = 8.45425370537707e-318;
  (**(code **)*puVar8)(local_1a8,puVar8);
  bVar3 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
  puVar17 = local_290;
  local_290 = (undefined1  [8])0xc;
  local_288.n_ = 8.45447109426124e-318;
  (**(code **)*puVar8)(local_1a8,puVar8,puVar17);
  bVar4 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  pVar1 = !bVar2 + dont_enum;
  if (bVar3) {
    pVar1 = (uint)!bVar2;
  }
  attributes = pVar1 + dont_delete;
  if (bVar4) {
    attributes = pVar1;
  }
  poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
  local_1a8 = (undefined1  [8])0x3;
  local_1a0[0].n_ = L"get";
  bVar2 = object::has_property(poVar9,(wstring_view *)local_1a8);
  if (bVar2) {
LAB_001593b5:
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
    local_268 = (undefined1  [8])0x5;
    pwVar15 = L"value";
    local_260.n_ = 8.45395726598957e-318;
    bVar2 = object::has_property(poVar9,(wstring_view *)local_268);
    if (bVar2) {
LAB_00159e0a:
      pnVar13 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar14 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_238);
      global_object::stack_trace_abi_cxx11_((wstring *)local_1a8,pgVar14);
      local_290 = (undefined1  [8])local_1a0[0]._0_8_;
      local_288.n_ = (double)local_1a8;
      local_268 = (undefined1  [8])0x46;
      local_260.n_ = 8.44032599482081e-318;
      native_error_exception::native_error_exception
                (pnVar13,type,(wstring_view *)local_290,(string_view *)local_268);
      __cxa_throw(pnVar13,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
    local_210.desc = (object_ptr *)0x8;
    local_210.a = (property_attribute *)0x1a1c14;
    bVar2 = object::has_property(poVar9,(wstring_view *)&local_210);
    if (bVar2) goto LAB_00159e0a;
  }
  else {
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
    local_290 = (undefined1  [8])0x3;
    pwVar15 = L"set";
    local_288.n_ = 8.43413535227842e-318;
    bVar2 = object::has_property(poVar9,(wstring_view *)local_290);
    if (bVar2) goto LAB_001593b5;
  }
  if (invalid < local_2ac) {
    __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x24,"bool mjs::is_valid(property_attribute)");
  }
  if (local_2ac == invalid) {
    pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    if (*(char *)((long)pvVar10 + 0x1c) == '\x01') {
      bVar2 = is_accessor_descriptor((object_ptr *)local_2a8);
      if (((!bVar2) && (bVar2 = is_data_descriptor((object_ptr *)local_2a8), !bVar2)) ||
         (bVar2 = is_data_descriptor((object_ptr *)local_2a8), bVar2)) {
        plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_290 = (undefined1  [8])0x5;
        local_288.n_ = 8.45395726598957e-318;
        (**(code **)*puVar8)(local_1a8,puVar8);
        (**(code **)(*plVar6 + 8))(plVar6,local_2a8._16_8_,local_1a8,attributes);
        value::destroy((value *)local_1a8);
      }
      else {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_290 = (undefined1  [8])0x3;
        local_288.n_ = 8.43405630177508e-318;
        (**(code **)*puVar8)(local_1a8,puVar8);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_268 = (undefined1  [8])0x3;
        local_260.n_ = 8.43413535227842e-318;
        (**(code **)*puVar8)(local_290,puVar8);
        global_00 = local_238;
        if (local_290._0_4_ == 0 && local_1a8._0_4_ == es1) {
          __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                        ,0x6e,
                        "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                       );
        }
        local_268 = (undefined1  [8])local_2a8._16_8_;
        local_260.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_238;
        value::value((value *)&local_1f8,(value *)local_1a8);
        define_own_property::anon_class_16_2_d5e5c5aa::operator()
                  ((anon_class_16_2_d5e5c5aa *)local_268,"Getter",(value *)&local_1f8);
        value::destroy((value *)&local_1f8);
        value::value((value *)&local_1d0,(value *)local_290);
        define_own_property::anon_class_16_2_d5e5c5aa::operator()
                  ((anon_class_16_2_d5e5c5aa *)local_268,"Setter",(value *)&local_1d0);
        value::destroy((value *)&local_1d0);
        define_accessor_property
                  ((gc_heap_ptr<mjs::global_object> *)global_00,o,(string *)local_2a8._16_8_,
                   (value *)local_1a8,(value *)local_290,attributes);
        value::destroy((value *)local_290);
        value::destroy((value *)local_1a8);
      }
      goto LAB_00159851;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
    pwVar12 = std::operator<<((wostream *)local_1a8,"cannot define property: ");
    puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
    pwVar12 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        (pwVar12,(wchar_t *)(puVar7 + 1),(ulong)*puVar7);
    std::operator<<(pwVar12,", object is not extensible");
    goto LAB_00159f43;
  }
  p_00._M_str = pwVar15;
  p_00._M_len = (size_t)L"writable";
  bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x8,p_00);
  if ((((!bVar2) &&
       (p_01._M_str = pwVar15, p_01._M_len = (size_t)L"enumerable",
       bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0xa,p_01), !bVar2)) &&
      ((p_02._M_str = pwVar15, p_02._M_len = (size_t)L"configurable",
       bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0xc,p_02), !bVar2 &&
       ((p_03._M_str = pwVar15, p_03._M_len = (size_t)L"value",
        bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x5,p_03), !bVar2 &&
        (p_04._M_str = pwVar15, p_04._M_len = (size_t)L"get",
        bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x3,p_04), !bVar2))))))
     && (p_05._M_str = pwVar15, p_05._M_len = (size_t)L"set",
        bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x3,p_05), !bVar2)) {
LAB_00159851:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
    return;
  }
  if (local_2ac == attributes) {
    puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
    local_260.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)(puVar7 + 1);
    local_268 = (undefined1  [8])(ulong)*puVar7;
    (**(code **)*puVar8)(local_1a8,puVar8);
    puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
    local_210.desc = (object_ptr *)0x5;
    local_210.a = (property_attribute *)0x1a1bfc;
    pwVar15 = (wchar_t *)*puVar8;
    (**(code **)pwVar15)(local_290,puVar8);
    bVar2 = operator==((value *)local_1a8,(value *)local_290);
    value::destroy((value *)local_290);
    value::destroy((value *)local_1a8);
    if (bVar2) goto LAB_00159851;
  }
  bVar2 = has_attributes(local_2ac,dont_delete);
  if (bVar2) {
    bVar2 = has_attributes(attributes,dont_delete);
    if (bVar2) {
      p_06._M_str = pwVar15;
      p_06._M_len = (size_t)L"enumerable";
      bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0xa,p_06);
      if (bVar2) {
        bVar2 = has_attributes(local_2ac,dont_enum);
        bVar3 = has_attributes(attributes,dont_enum);
        if (bVar2 != bVar3) goto LAB_00159c1a;
      }
      goto LAB_00159682;
    }
    goto LAB_00159c1a;
  }
LAB_00159682:
  bVar2 = is_accessor_descriptor((object_ptr *)local_2a8);
  if ((bVar2) || (bVar2 = is_data_descriptor((object_ptr *)local_2a8), bVar2)) {
    bVar2 = has_attributes(local_2ac,accessor);
    bVar3 = is_data_descriptor((object_ptr *)local_2a8);
    if (bVar2 == bVar3) {
      bVar2 = has_attributes(local_2ac,dont_delete);
      if (bVar2) goto LAB_00159c1a;
      goto LAB_00159872;
    }
    bVar2 = has_attributes(local_2ac,accessor);
    if (bVar2) {
      bVar2 = has_attributes(local_2ac,accessor);
      if ((!bVar2) || (bVar2 = is_accessor_descriptor((object_ptr *)local_2a8), !bVar2)) {
        __assert_fail("has_attributes(current_attributes, property_attribute::accessor) && is_accessor_descriptor(desc)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                      ,0xae,
                      "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                     );
      }
      goto LAB_00159872;
    }
    bVar2 = has_attributes(local_2ac,dont_delete);
    if ((!bVar2) || (bVar2 = has_attributes(local_2ac,read_only), !bVar2)) goto LAB_00159872;
    bVar2 = has_attributes(attributes,read_only);
    if (bVar2) {
      p_08._M_str = pwVar15;
      p_08._M_len = (size_t)L"value";
      bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x5,p_08);
      if (bVar2) {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
        local_260.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar7 + 1);
        local_268 = (undefined1  [8])(ulong)*puVar7;
        (**(code **)*puVar8)(local_1a8,puVar8);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_210.desc = (object_ptr *)0x5;
        local_210.a = (property_attribute *)0x1a1bfc;
        pwVar15 = (wchar_t *)*puVar8;
        (**(code **)pwVar15)(local_290,puVar8);
        bVar2 = operator==((value *)local_1a8,(value *)local_290);
        value::destroy((value *)local_290);
        value::destroy((value *)local_1a8);
        if (!bVar2) goto LAB_00159c1a;
      }
      goto LAB_00159872;
    }
LAB_00159c1a:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
  }
  else {
LAB_00159872:
    local_210.a = (property_attribute *)&local_23c;
    local_23c = L'\0';
    local_210.current_attributes = &local_2ac;
    local_210.desc = (object_ptr *)local_2a8;
    define_own_property::anon_class_24_3_a4a98722::operator()(&local_210,L"enumerable",dont_enum);
    define_own_property::anon_class_24_3_a4a98722::operator()
              (&local_210,L"configurable",dont_delete);
    bVar2 = is_accessor_descriptor((object_ptr *)local_2a8);
    if ((bVar2) ||
       (((bVar2 = is_accessor_descriptor((object_ptr *)local_2a8), !bVar2 &&
         (bVar2 = is_data_descriptor((object_ptr *)local_2a8), !bVar2)) &&
        (bVar2 = has_attributes(local_2ac,accessor), bVar2)))) {
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
      local_290 = (undefined1  [8])0x3;
      local_288.n_ = 8.43405630177508e-318;
      (**(code **)*puVar8)(local_1a8,puVar8);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
      local_268 = (undefined1  [8])0x3;
      local_260.n_ = 8.43413535227842e-318;
      (**(code **)*puVar8)(local_290,puVar8);
      bVar2 = has_attributes(local_2ac,accessor);
      if (bVar2) {
        pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        puVar11 = (undefined4 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
        name._M_str._0_4_ = *puVar11;
        name._M_len = (size_t)pvVar10;
        name._M_str._4_4_ = 0;
        object::get_accessor_property_object((object *)local_230,name);
        poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_268 = (undefined1  [8])0x3;
        local_260.n_ = 8.43405630177508e-318;
        bVar2 = object::has_property(poVar9,(wstring_view *)local_268);
        if (!bVar2) {
          poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
          local_268 = (undefined1  [8])0x3;
          local_260.n_ = 8.43405630177508e-318;
          bVar2 = object::has_property(poVar9,(wstring_view *)local_268);
          if (bVar2) {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
            local_230._16_4_ = 3;
            local_230._20_4_ = 0;
            local_230._24_8_ = L"get";
            (**(code **)*puVar8)(local_268,puVar8);
            value::operator=((value *)local_1a8,(value *)local_268);
            value::destroy((value *)local_268);
          }
LAB_00159ca9:
          if (local_290._0_4_ == 0) {
            poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
            local_268 = (undefined1  [8])0x3;
            local_260.n_ = 8.43413535227842e-318;
            bVar2 = object::has_property(poVar9,(wstring_view *)local_268);
            if (bVar2) {
              puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
              local_230._16_4_ = 3;
              local_230._20_4_ = 0;
              local_230._24_8_ = L"set";
              (**(code **)*puVar8)(local_268,puVar8);
              value::operator=((value *)local_290,(value *)local_268);
              value::destroy((value *)local_268);
            }
          }
          else {
            bVar2 = has_attributes(local_2ac,read_only);
            if (bVar2) {
              puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
              local_230._16_4_ = 3;
              local_230._20_4_ = 0;
              local_230._24_8_ = L"set";
              (**(code **)*puVar8)(local_268,puVar8);
              bVar2 = operator==((value *)local_290,(value *)local_268);
              value::destroy((value *)local_268);
              if (!bVar2) goto LAB_00159d16;
            }
          }
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_230);
          goto LAB_00159da6;
        }
        bVar2 = has_attributes(local_2ac,read_only);
        if (!bVar2) goto LAB_00159ca9;
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
        local_230._16_4_ = 3;
        local_230._20_4_ = 0;
        local_230._24_8_ = L"get";
        (**(code **)*puVar8)(local_268,puVar8);
        bVar2 = operator==((value *)local_1a8,(value *)local_268);
        value::destroy((value *)local_268);
        if (bVar2) goto LAB_00159ca9;
LAB_00159d16:
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_230);
        bVar2 = false;
      }
      else {
LAB_00159da6:
        bVar2 = true;
        define_accessor_property
                  ((gc_heap_ptr<mjs::global_object> *)local_238,o,(string *)local_2a8._16_8_,
                   (value *)local_1a8,(value *)local_290,local_23c);
      }
      value::destroy((value *)local_290);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
      if (bVar2) {
        return;
      }
    }
    else {
      define_own_property::anon_class_24_3_a4a98722::operator()(&local_210,L"writable",read_only);
      plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      pwVar16 = L"value";
      p_07._M_str = pwVar15;
      p_07._M_len = (size_t)L"value";
      bVar2 = has_own_property((anon_unknown_33 *)local_2a8,(object_ptr *)0x5,p_07);
      if (bVar2) {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_290 = (undefined1  [8])0x5;
      }
      else {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
        pwVar16 = (wchar_t *)(puVar7 + 1);
        local_268 = (undefined1  [8])(ulong)*puVar7;
        puVar17 = local_268;
      }
      *(wchar_t **)(puVar17 + 8) = pwVar16;
      (**(code **)*puVar8)(local_1a8,puVar8,puVar17);
      cVar5 = (**(code **)(*plVar6 + 0x28))(plVar6,local_2a8._16_8_,local_1a8,local_23c);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
      if (cVar5 != '\0') {
        return;
      }
    }
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
  pwVar12 = std::operator<<((wostream *)local_1a8,"cannot redefine property: ");
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8._16_8_);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            (pwVar12,(wchar_t *)(puVar7 + 1),(ulong)*puVar7);
LAB_00159f43:
  pnVar13 = (native_error_exception *)__cxa_allocate_exception(0x58);
  pgVar14 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_238);
  global_object::stack_trace_abi_cxx11_((wstring *)local_290,pgVar14);
  local_1d0 = (wchar_t *)local_288.n_;
  local_1c8.n_ = (double)local_290;
  std::__cxx11::wstringbuf::str();
  local_268 = (undefined1  [8])local_1f0.n_;
  local_260.n_ = (double)local_1f8;
  native_error_exception::native_error_exception
            (pnVar13,type,(wstring_view *)&local_1d0,(wstring_view *)local_268);
  __cxa_throw(pnVar13,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void define_own_property_checked(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& p, const value& desc) {
    const auto res = define_own_property(global, o, p, global->validate_object(desc));
    if (res == define_own_property_result::ok) {
        return;
    }

    std::wostringstream woss;
    if (res == define_own_property_result::cannot_redefine) {
        woss << "cannot redefine property: " << p.view();
    } else {
        assert(res == define_own_property_result::not_extensible);
        woss << "cannot define property: " << p.view() << ", object is not extensible";
    }
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}